

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O0

int verify_stable(int **array,int64_t size,int num_values)

{
  int64_t iVar1;
  int in_EDX;
  long in_RSI;
  int **in_RDI;
  int64_t j;
  int64_t i;
  int value;
  int64_t local_30;
  int64_t local_28;
  int local_20;
  
  local_28 = 0;
  local_30 = 0;
  local_20 = 0;
  do {
    if (in_EDX <= local_20) {
      return 1;
    }
    while (local_28 = find_next(original,local_28,in_RSI,local_20), local_28 != in_RSI) {
      iVar1 = find_next(in_RDI,local_30,in_RSI,local_20);
      if (iVar1 == in_RSI) {
        return 0;
      }
      if (original[local_28] != in_RDI[iVar1]) {
        return 0;
      }
      local_28 = local_28 + 1;
      local_30 = iVar1 + 1;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

int verify_stable(int **array, int64_t size, int num_values) {
  int value;
  int64_t i = 0;
  int64_t j = 0;

  for (value = 0; value < num_values; value++) {
    while (1) {
      i = find_next(original, i, size, value);

      /* unlikely, but possible */
      if (i == size) {
        break;
      }

      j = find_next(array, j, size, value);

      if (j == size) {
        return 0;
      }

      if (original[i] != array[j]) {
        return 0;
      }

      i++;
      j++;
    }
  }

  return 1;
}